

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O0

void testStandardAttributes(string *tempDir)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *__rhs;
  ostream *this;
  exception *e;
  string filename_3;
  string filename_2;
  string filename_1;
  string fn2_1;
  string fn1_1;
  string fn2;
  string fn1;
  string filename;
  char *in_stack_00000140;
  char *in_stack_00000238;
  char *in_stack_00000240;
  char *in_stack_00000300;
  char *in_stack_00000340;
  char *in_stack_00000360;
  char *in_stack_fffffffffffffed0;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<((ostream *)&std::cout,"Testing optional standard attributes");
  std::ostream::operator<<(__lhs,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1dc86c::convertRGBtoXYZ();
  std::operator+(__lhs,in_stack_fffffffffffffed0);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_1dc86c::writeReadChromaticities(in_stack_00000360);
  std::__cxx11::string::~string(local_38);
  std::operator+(__lhs,in_stack_fffffffffffffed0);
  std::operator+(__lhs,in_stack_fffffffffffffed0);
  __rhs = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_1dc86c::latLongMap(in_stack_00000140,(char *)filename.field_2._8_8_);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::operator+(__lhs,__rhs);
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_1dc86c::cubeMap(in_stack_00000240,in_stack_00000238);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_1dc86c::writeReadKeyCode(in_stack_00000360);
  std::__cxx11::string::~string(local_d8);
  anon_unknown.dwarf_1dc86c::timeCodeMethods();
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_1dc86c::writeReadTimeCode(in_stack_00000300);
  std::__cxx11::string::~string(local_f8);
  anon_unknown.dwarf_1dc86c::rationalMethods();
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_1dc86c::writeReadRational(in_stack_00000340);
  std::__cxx11::string::~string(local_118);
  anon_unknown.dwarf_1dc86c::generatedFunctions();
  this = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testStandardAttributes (const std::string &tempDir)
{
    try
    {
	cout << "Testing optional standard attributes" << endl;

	convertRGBtoXYZ();

	{
	    std::string filename = tempDir + "imf_test_chromaticities.exr";
	    writeReadChromaticities (filename.c_str());
	}

	{
	    std::string fn1 = tempDir + "imf_test_latlong1.exr";
	    std::string fn2 = tempDir + "imf_test_latlong2.exr";
	    latLongMap (fn1.c_str(), fn2.c_str());
	}

	{
	    std::string fn1 = tempDir + "imf_test_cube1.exr";
	    std::string fn2 = tempDir + "imf_test_cube2.exr";
	    cubeMap (fn1.c_str(), fn2.c_str());
	}

	{
	    std::string filename = tempDir + "imf_test_keycode.exr";
	    writeReadKeyCode (filename.c_str());
	}

	{
	    timeCodeMethods();
	    std::string filename = tempDir + "imf_test_timecode.exr";
	    writeReadTimeCode (filename.c_str());
	}

	{
	    rationalMethods();
	    std::string filename = tempDir + "imf_test_rational.exr";
	    writeReadRational (filename.c_str());
	}

	generatedFunctions();

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}